

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

EnumValueDescriptor * __thiscall
google::protobuf::internal::GeneratedMessageReflection::GetEnum
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  int key;
  LogMessage *pLVar1;
  EnumValueDescriptor *pEVar2;
  LogFinisher local_99;
  LogMessage local_98;
  LogMessage local_60;
  
  if (*(Descriptor **)(field + 0x38) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetEnum","Field does not match message type.");
  }
  if (*(int *)(field + 0x30) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetEnum",
               "Field is repeated; the method requires a singular field.");
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4) != 8) {
    anon_unknown_0::ReportReflectionUsageTypeError(this->descriptor_,field,"GetEnum",CPPTYPE_ENUM);
  }
  if (field[0x34] == (FieldDescriptor)0x1) {
    if (this->extensions_offset_ == -1) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
                 ,0x4ae);
      pLVar1 = LogMessage::operator<<(&local_60,"CHECK failed: (extensions_offset_) != (-1): ");
      LogFinisher::operator=((LogFinisher *)&local_98,pLVar1);
      LogMessage::~LogMessage(&local_60);
    }
    key = ExtensionSet::GetEnum
                    ((ExtensionSet *)
                     ((long)&(message->super_MessageLite)._vptr_MessageLite +
                     (long)this->extensions_offset_),*(int *)(field + 0x28),
                     *(int *)(*(long *)(field + 0x70) + 0x10));
  }
  else {
    key = *(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                  (long)this->offsets_
                        [(int)((ulong)((long)field - *(long *)(*(long *)(field + 0x38) + 0x30)) >> 3
                              ) * -0x11111111]);
  }
  pEVar2 = EnumDescriptor::FindValueByNumber(*(EnumDescriptor **)(field + 0x50),key);
  if (pEVar2 == (EnumValueDescriptor *)0x0) {
    LogMessage::LogMessage
              (&local_98,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
               ,0x38d);
    pLVar1 = LogMessage::operator<<(&local_98,"CHECK failed: result != NULL: ");
    pLVar1 = LogMessage::operator<<(pLVar1,"Value ");
    pLVar1 = LogMessage::operator<<(pLVar1,key);
    pLVar1 = LogMessage::operator<<(pLVar1," is not valid for field ");
    pLVar1 = LogMessage::operator<<(pLVar1,*(string **)(field + 8));
    pLVar1 = LogMessage::operator<<(pLVar1," of type ");
    pLVar1 = LogMessage::operator<<(pLVar1,*(string **)(*(long *)(field + 0x50) + 8));
    pLVar1 = LogMessage::operator<<(pLVar1,".");
    LogFinisher::operator=(&local_99,pLVar1);
    LogMessage::~LogMessage(&local_98);
  }
  return pEVar2;
}

Assistant:

const EnumValueDescriptor* GeneratedMessageReflection::GetEnum(
    const Message& message, const FieldDescriptor* field) const {
  USAGE_CHECK_ALL(GetEnum, SINGULAR, ENUM);

  int value;
  if (field->is_extension()) {
    value = GetExtensionSet(message).GetEnum(
      field->number(), field->default_value_enum()->number());
  } else {
    value = GetField<int>(message, field);
  }
  const EnumValueDescriptor* result =
    field->enum_type()->FindValueByNumber(value);
  GOOGLE_CHECK(result != NULL) << "Value " << value << " is not valid for field "
                        << field->full_name() << " of type "
                        << field->enum_type()->full_name() << ".";
  return result;
}